

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

string * chooseMap_abi_cxx11_(void)

{
  pointer pcVar1;
  pointer pbVar2;
  int iVar3;
  pointer this;
  ostream *poVar4;
  string *extraout_RAX;
  ulong uVar5;
  string *in_RDI;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *map;
  pointer pbVar7;
  undefined1 auVar8 [16];
  directory_iterator __begin1;
  uint mapChoice;
  directory_iterator local_f8;
  string_type local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  path local_a8;
  string *local_68;
  directory_iterator local_60;
  long *local_50 [2];
  long local_40 [2];
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = in_RDI;
  std::experimental::filesystem::v1::current_path_abi_cxx11_((v1 *)&local_a8);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            (&local_60,&local_a8,none,(error_code *)0x0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_a8);
  if (local_60._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_f8._M_dir.
    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_60._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_f8._M_dir.
    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_60._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 8) =
           *(int *)(local_60._M_dir.
                    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 8) + 1;
      UNLOCK();
      local_f8._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_60._M_dir.
                super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_f8._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_60._M_dir.
           super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_60._M_dir.
          super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_00111dec;
    }
    else {
      *(int *)(local_60._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 8) =
           *(int *)(local_60._M_dir.
                    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 8) + 1;
    }
    local_f8._M_dir.
    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_60._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_f8._M_dir.
    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_60._M_dir.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_60._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 8) =
           *(int *)(local_60._M_dir.
                    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_60._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 8) =
           *(int *)(local_60._M_dir.
                    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
LAB_00111dec:
  while (local_f8._M_dir.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this = (pointer)std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*
                              (&local_f8);
    auVar8 = std::experimental::filesystem::v1::__cxx11::path::_M_find_extension((path *)this);
    if (auVar8._8_8_ != -1 && auVar8._0_8_ != 0) {
      auVar8 = std::experimental::filesystem::v1::__cxx11::path::_M_find_extension((path *)this);
      if (auVar8._8_8_ == -1 || auVar8._0_8_ == 0) {
        local_a8._M_pathname._M_dataplus._M_p = (pointer)&local_a8._M_pathname.field_2;
        local_a8._M_pathname._M_string_length = 0;
        local_a8._M_pathname.field_2._M_local_buf[0] = '\0';
        local_a8._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_a8._49_8_ = 0;
        local_a8._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_a8._M_cmpts.
        super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_e8,auVar8._0_8_);
        std::experimental::filesystem::v1::__cxx11::path::path(&local_a8,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      local_50[0] = local_40;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_50,local_a8._M_pathname._M_dataplus._M_p,
                 local_a8._M_pathname._M_dataplus._M_p + local_a8._M_pathname._M_string_length);
      iVar3 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_a8);
      if (iVar3 == 0) {
        if ((this->super_path)._M_pathname._M_string_length == 0) {
          local_a8._M_pathname._M_dataplus._M_p = (pointer)&local_a8._M_pathname.field_2;
          local_a8._M_pathname._M_string_length = 0;
          local_a8._M_pathname.field_2._M_local_buf[0] = '\0';
          local_a8._M_cmpts.
          super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_a8._49_8_ = 0;
          local_a8._M_cmpts.
          super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8._M_cmpts.
          super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_a8._M_cmpts.
          super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        }
        else {
          if ((this->super_path)._M_type == _Multi) {
            this = (((_List *)(&(this->super_path)._M_pathname + 1))->
                   super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
                   )._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          std::experimental::filesystem::v1::__cxx11::path::path(&local_a8,&this->super_path);
        }
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,local_a8._M_pathname._M_dataplus._M_p,
                   local_a8._M_pathname._M_dataplus._M_p + local_a8._M_pathname._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                   &local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_a8);
      }
    }
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++(&local_f8);
  }
  if (local_60._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    *(string **)local_68 = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(local_68,"");
  }
  else {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nplease choose a map :\n",0x17);
      pbVar2 = local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = 0;
      for (pbVar7 = local_c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1
          ) {
        uVar6 = uVar6 + 1;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
      std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
      std::istream::ignore((long)&std::cin,0x200);
    } while (uVar6 <= (int)local_a8._M_pathname._M_dataplus._M_p - 1U);
    uVar5 = (ulong)((int)local_a8._M_pathname._M_dataplus._M_p - 1U);
    if ((ulong)((long)local_c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    *(string **)local_68 = local_68 + 0x10;
    pcVar1 = local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              (local_68,pcVar1,
               pcVar1 + local_c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return extraout_RAX;
}

Assistant:

static std::string chooseMap() {
    vector<std::string> mapList = vector<std::string>();
    for (const auto& entry : fs::directory_iterator(fs::current_path())) {
        if (entry.path().has_extension() && entry.path().extension().string() == ".map") {
            mapList.push_back(entry.path().filename());
        }
    }
    if (!mapList.empty()) {
        unsigned int mapChoice;
        unsigned int numberMaps;
        do {
            cout << "\nplease choose a map :\n";
            numberMaps = 0;
            for (const auto& map : mapList) {
                numberMaps++;
                cout << numberMaps << " - " << map << "\n";
            }
            cin >> mapChoice;
            cin.clear();
            cin.ignore(512, '\n');
        } while (mapChoice < 1 || mapChoice > numberMaps || isnan(mapChoice));
        return std::string(mapList.at(mapChoice - 1));
    }
    return "";
}